

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O3

int perm5(int z,int p_high,int p_low)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint auStack_68 [2];
  int p [14];
  uint auStack_28 [2];
  int z_bit [5];
  
  lVar3 = 0;
  do {
    auStack_68[lVar3] = (uint)(((uint)p_low >> ((uint)lVar3 & 0x1f) & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  lVar3 = 0;
  do {
    p[lVar3 + 7] = (uint)(((uint)p_high >> ((uint)lVar3 & 0x1f) & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    auStack_28[lVar3] = (uint)(((uint)z >> ((uint)lVar3 & 0x1f) & 1) != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0xd;
  do {
    if (auStack_68[lVar3] != 0) {
      uVar1 = auStack_28[*(int *)(&DAT_0010b8a0 + lVar3 * 4)];
      iVar2 = *(int *)(&DAT_0010b8e0 + lVar3 * 4);
      auStack_28[*(int *)(&DAT_0010b8a0 + lVar3 * 4)] = auStack_28[iVar2];
      auStack_28[iVar2] = uVar1;
    }
    bVar4 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar4);
  lVar3 = 0;
  iVar2 = 0;
  do {
    iVar2 = iVar2 + (auStack_28[lVar3] << ((byte)lVar3 & 0x1f));
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return iVar2;
}

Assistant:

int perm5(int z, int p_high, int p_low)
{
	int i, tmp, output, z_bit[5], p[14];
	int index1[] = {0, 2, 1, 3, 0, 1, 0, 3, 1, 0, 2, 1, 0, 1};
	int index2[] = {1, 3, 2, 4, 4, 3, 2, 4, 4, 3, 4, 3, 3, 2};

	/* bits of p_low and p_high are control signals */
	for (i = 0; i < 9; i++)
		p[i] = (p_low >> i) & 0x01;
	for (i = 0; i < 5; i++)
		p[i+9] = (p_high >> i) & 0x01;

	/* bit swapping will be easier with an array of bits */
	for (i = 0; i < 5; i++)
		z_bit[i] = (z >> i) & 0x01;

	/* butterfly operations */
	for (i = 13; i >= 0; i--) {
		/* swap bits according to index arrays if control signal tells us to */
		if (p[i]) {
			tmp = z_bit[index1[i]];
			z_bit[index1[i]] = z_bit[index2[i]];
			z_bit[index2[i]] = tmp;
		}
	}

	/* reconstruct output from rearranged bits */
	output = 0;
	for (i = 0; i < 5; i++)
		output += z_bit[i] << i;

	return(output);
}